

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_scatter_single(bsc_step_t depends,bsc_pid_t root,bsc_group_t group,void *src,void *dst,
                  bsc_size_t size)

{
  uint uVar1;
  bsp_pid_t bVar2;
  bsc_pid_t dst_pid;
  ulong uVar3;
  ulong uVar4;
  
  if (group == (bsc_group_t)0x0) {
    uVar1 = bsp_nprocs();
  }
  else {
    uVar1 = *group;
  }
  bVar2 = bsp_pid();
  if (bVar2 == root) {
    uVar3 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = 0;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      if (group == (bsc_group_t)0x0) {
        dst_pid = (bsc_pid_t)uVar3;
      }
      else {
        dst_pid = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + uVar3 * 4);
      }
      bsc_put(depends,dst_pid,src,dst,0,size);
      src = (void *)((long)src + (long)size);
    }
  }
  return depends + 1;
}

Assistant:

bsc_step_t bsc_scatter_single( bsc_step_t depends,
                        bsc_pid_t root, bsc_group_t group,
                       const void * src, void *dst, bsc_size_t size )
{
    const group_t * g = group;
    bsc_pid_t i, P = g?g->size:bsp_nprocs() ;
    if ( bsp_pid() == root ) {
        for ( i = 0; i < P; ++i ) {
            bsc_pid_t m = g?g->gid[i]:i;
            const char * src_bytes = src;
            bsc_put( depends, m, src_bytes + i * size, dst, 0, size );
        }
    }
    return depends + 1;
}